

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uptime.cpp
# Opt level: O0

void pstore::broker::uptime(not_null<std::atomic<bool>_*> done)

{
  bool bVar1;
  atomic *this;
  double __x;
  double __x_00;
  not_null<const_char_*> local_50;
  uint64_t local_48;
  int local_3c;
  duration<long,_std::ratio<1L,_1L>_> local_38;
  duration local_30;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_28;
  time_point until;
  uint64_t seconds;
  atomic<bool> *local_10;
  not_null<std::atomic<bool>_*> done_local;
  
  local_10 = done.ptr_;
  pstore::gsl::not_null<const_char_*>::not_null
            ((not_null<const_char_*> *)&seconds,"uptime 1 second tick starting");
  log((pstore *)0x6,__x);
  until.__d.__r = (duration)0;
  local_28.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  while( true ) {
    this = (atomic *)pstore::gsl::not_null::operator_cast_to_atomic_((not_null *)&local_10);
    bVar1 = std::atomic::operator_cast_to_bool(this);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_3c = 1;
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_38,&local_3c);
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
              ((duration<long,std::ratio<1l,1000000000l>> *)&local_30,&local_38);
    std::chrono::
    time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::operator+=(&local_28,&local_30);
    std::this_thread::
    sleep_until<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
              (&local_28);
    local_48 = (long)until.__d.__r + 1;
    until.__d.__r = (duration)(duration)local_48;
    brokerface::channel<pstore::descriptor_condition_variable>::
    publish<pstore::broker::uptime(pstore::gsl::not_null<std::atomic<bool>*>)::__0>
              ((channel<pstore::descriptor_condition_variable> *)uptime_channel,
               (anon_class_8_1_f8c77d5f)local_48);
  }
  pstore::gsl::not_null<const_char_*>::not_null(&local_50,"uptime thread exiting");
  log((pstore *)0x6,__x_00);
  return;
}

Assistant:

void uptime (gsl::not_null<std::atomic<bool> *> const done) {
            log (logger::priority::info, "uptime 1 second tick starting");

            auto seconds = std::uint64_t{0};
            auto until = std::chrono::system_clock::now ();
            while (!*done) {
                until += std::chrono::seconds{1};
                std::this_thread::sleep_until (until);
                ++seconds;

                uptime_channel.publish ([seconds] () {
                    std::ostringstream os;
                    os << "{ \"uptime\": " << seconds << " }";
                    std::string const & str = os.str ();
                    PSTORE_ASSERT (json::is_valid (str));
                    return str;
                });
            }

            log (logger::priority::info, "uptime thread exiting");
        }